

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O1

int If_ManImproveNodeFaninCost(If_Man_t *p,If_Obj_t *pObj)

{
  uint uVar1;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
    uVar1 = -(uint)(pObj->nRefs == 0);
    if (((pObj->pFanin0->field_0x1 & 1) == 0) && (pObj->pFanin0->nRefs == 0)) {
      uVar1 = (uint)(pObj->nRefs != 0);
    }
    if ((pObj->pFanin1->field_0x1 & 1) == 0) {
      uVar1 = uVar1 + (pObj->pFanin1->nRefs == 0);
    }
    return uVar1;
  }
  __assert_fail("If_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifReduce.c"
                ,0x121,"int If_ManImproveNodeFaninCost(If_Man_t *, If_Obj_t *)");
}

Assistant:

static inline If_Obj_t * If_ObjFanin0( If_Obj_t * pObj )                     { return pObj->pFanin0;                 }